

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,undefined8 param_3,
                         undefined8 param_4,String *param_5)

{
  Array<char> local_40;
  Array<char> local_28;
  
  BTreeImpl::MaybeUint::toString((String *)&local_28,(MaybeUint *)*param_2);
  BTreeImpl::MaybeUint::toString((String *)&local_40,(MaybeUint *)param_2[1]);
  concat<kj::String,kj::StringPtr&,kj::String>
            (__return_storage_ptr__,(_ *)&local_28,(String *)(param_2 + 2),(StringPtr *)&local_40,
             param_5);
  Array<char>::~Array(&local_40);
  Array<char>::~Array(&local_28);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}